

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool inja::Renderer::truthy(json *data)

{
  value_t vVar1;
  bool bVar2;
  undefined8 uStack_10;
  
  vVar1 = (data->m_data).m_type;
  if (vVar1 == boolean) {
    uStack_10 = uStack_10 & 0xffffffffffffff;
    nlohmann::json_abi_v3_11_3::detail::
    from_json<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
              (data,(boolean_t *)((long)&uStack_10 + 7));
    return (bool)uStack_10._7_1_;
  }
  if ((byte)(vVar1 - number_integer) < 3) {
    bVar2 = nlohmann::json_abi_v3_11_3::operator!=<int,_0>(data,0);
    return bVar2;
  }
  if (vVar1 != null) {
    uStack_10 = 0x13db47;
    bVar2 = nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::empty(data);
    return !bVar2;
  }
  return false;
}

Assistant:

constexpr bool is_boolean() const noexcept
    {
        return m_data.m_type == value_t::boolean;
    }